

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  vector<char,_std::allocator<char>_> *this;
  byte *pbVar1;
  pointer ppcVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  pointer pAVar5;
  pointer pAVar6;
  undefined8 uVar7;
  uint16_t uVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  pointer pAVar13;
  undefined4 extraout_var;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar14;
  char *pcVar15;
  int *piVar16;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  *__args_1;
  vector<char_*,_std::allocator<char_*>_> *pvVar17;
  uint uVar18;
  int *__args;
  int *extraout_RDX;
  int iVar19;
  AtFileStackEntry *__p;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  *__p_00;
  pointer puVar20;
  basic_streambuf<char,_std::char_traits<char>_> *pbVar21;
  optional<std::filesystem::__cxx11::path> *this_00;
  long lVar22;
  ulong uVar23;
  pointer __a;
  ulong uVar24;
  initializer_list<char_*> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> atFileStack;
  File file;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  local_1d8;
  pointer local_1b8;
  pointer in_stack_fffffffffffffe50;
  pointer puVar25;
  vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> local_198;
  uint local_17c;
  ulong local_178;
  pointer local_170;
  AtFileStackEntry *local_168;
  char *local_160;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  local_158;
  undefined1 local_68;
  _Alloc_hider local_60 [5];
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
  local_38;
  
  local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = (ulong)(uint)argc;
  local_17c = argc;
  local_168 = (AtFileStackEntry *)argv;
LAB_001049a3:
  iVar19 = (int)uVar12;
  __p = (AtFileStackEntry *)argv;
  iVar9 = musl_getopt_long_only
                    (iVar19,argv,"-Aa:b:Cc:Dd:FfhL:mN:n:Oo:Pp:Qq:r:s:Tt:U:uVvx:Z",longopts,
                     (int *)0x0);
  while( true ) {
    if (iVar9 == -1) goto LAB_00105168;
    pcVar15 = musl_optarg;
    local_158._M_first._M_storage =
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)musl_optarg;
    if (iVar9 < 0x41) break;
    switch(iVar9) {
    case 0x41:
switchD_001049f0_caseD_41:
      _ZL12localOptions_1 = 1;
      break;
    default:
      goto switchD_001049f0_caseD_42;
    case 0x43:
      options.useColorCurve = true;
      break;
    case 0x4c:
      options.inputSlice.left =
           parseNumber((char **)&local_158._M_first,"Input slice left coordinate",0xffff);
      uVar7 = local_158._M_first._M_storage;
      if ((short)options.inputSlice.left < 0) {
        pcVar15 = "Input slice left coordinate is out of range!";
        goto LAB_001050ed;
      }
      sVar11 = strspn((char *)local_158._M_first._M_storage," \t");
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11) ==
          (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
        pbVar21 = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11);
        sVar11 = strspn((char *)(pbVar21 + 1)," \t");
        local_158._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             (pbVar21 + sVar11 + 1);
        options.inputSlice.top =
             parseNumber((char **)&local_158._M_first,"Input slice upper coordinate",0xffff);
        uVar7 = local_158._M_first._M_storage;
        sVar11 = strspn((char *)local_158._M_first._M_storage," \t");
        if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11) ==
            (basic_streambuf<char,_std::char_traits<char>_>)0x3a) {
          pbVar21 = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11);
          sVar11 = strspn((char *)(pbVar21 + 1)," \t");
          local_158._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (pbVar21 + sVar11 + 1);
          uVar8 = parseNumber((char **)&local_158._M_first,"Input slice width",0xffff);
          uVar7 = local_158._M_first._M_storage;
          options.inputSlice.width = uVar8;
          sVar11 = strspn((char *)local_158._M_first._M_storage," \t");
          if (uVar8 == 0) {
            error("Input slice width may not be 0!");
          }
          pbVar21 = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11);
          if (*pbVar21 == (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
            sVar11 = strspn((char *)(pbVar21 + 1)," \t");
            local_158._M_first._M_storage =
                 (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
                 (pbVar21 + sVar11 + 1);
            options.inputSlice.height =
                 parseNumber((char **)&local_158._M_first,"Input slice height",0xffff);
            if (options.inputSlice.height == 0) {
              error("Input slice height may not be 0!");
            }
            if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
                (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
              main_cold_7();
            }
          }
          else {
            main_cold_6();
          }
        }
        else {
          main_cold_5();
        }
      }
      else {
        main_cold_4();
      }
      break;
    case 0x4e:
      options.maxNbTiles._M_elems[0] =
           parseNumber((char **)&local_158._M_first,"Number of tiles in bank 0",0x100);
      if (0x100 < options.maxNbTiles._M_elems[0]) {
        error("Bank 0 cannot contain more than 256 tiles");
      }
      uVar7 = local_158._M_first._M_storage;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage ==
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        options.maxNbTiles._M_elems[1] = 0;
      }
      else {
        sVar11 = strspn((char *)local_158._M_first._M_storage," \t");
        if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11) ==
            (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
          pbVar21 = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11);
          sVar11 = strspn((char *)(pbVar21 + 1)," \t");
          local_158._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (pbVar21 + sVar11 + 1);
          options.maxNbTiles._M_elems[1] =
               parseNumber((char **)&local_158._M_first,"Number of tiles in bank 1",0x100);
          if (0x100 < options.maxNbTiles._M_elems[1]) {
            error("Bank 1 cannot contain more than 256 tiles");
          }
          if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
              (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
            main_cold_3();
          }
        }
        else {
          main_cold_2();
        }
      }
      break;
    case 0x4f:
      _ZL12localOptions_5 = 1;
      break;
    case 0x50:
switchD_001049f0_caseD_50:
      _ZL12localOptions_3 = 1;
      break;
    case 0x51:
switchD_001049f0_caseD_51:
      _ZL12localOptions_4 = 1;
      break;
    case 0x54:
switchD_001049f0_caseD_54:
      _ZL12localOptions_2 = 1;
      break;
    case 0x56:
      goto switchD_001049f0_caseD_56;
    case 0x5a:
      options.columnMajor = true;
      break;
    case 0x61:
      _ZL12localOptions_1 = 0;
      this_00 = &options.attrmap;
      if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
        pcVar15 = "Overriding attrmap file %s";
LAB_00104ef9:
        warning(pcVar15,(pointer)(this_00->
                                 super__Optional_base<std::filesystem::__cxx11::path,_false,_false>)
                                 ._M_payload.
                                 super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>
                                 .super__Optional_payload_base<std::filesystem::__cxx11::path>.
                                 _M_payload._M_value._M_pathname._M_dataplus);
      }
      goto LAB_00104f03;
    case 0x62:
      uVar8 = parseNumber((char **)&local_158._M_first,"Bank 0 base tile ID",0);
      uVar7 = local_158._M_first._M_storage;
      options.baseTileIDs._M_elems[0] = (uchar)uVar8;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage ==
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        options.baseTileIDs._M_elems[1] = '\0';
      }
      else {
        sVar11 = strspn((char *)local_158._M_first._M_storage," \t");
        if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11) ==
            (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
          pbVar21 = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar11);
          sVar11 = strspn((char *)(pbVar21 + 1)," \t");
          local_158._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (pbVar21 + sVar11 + 1);
          uVar8 = parseNumber((char **)&local_158._M_first,"Bank 1 base tile ID",0);
          options.baseTileIDs._M_elems[1] = (uchar)uVar8;
          if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
              (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
            main_cold_11();
          }
        }
        else {
          main_cold_10();
        }
      }
      break;
    case 99:
      if (*musl_optarg == '#') {
        options.palSpecType = EXPLICIT;
        parseInlinePalSpec((char *)in_stack_fffffffffffffe50);
      }
      else {
        iVar9 = strcasecmp(musl_optarg,"embedded");
        if (iVar9 == 0) {
          options.palSpecType = EMBEDDED;
        }
        else {
          options.palSpecType = EXPLICIT;
          _ZL12localOptions_0 = pcVar15;
        }
      }
      break;
    case 100:
      uVar8 = parseNumber((char **)&local_158._M_first,"Bit depth",2);
      options.bitDepth = (uint8_t)uVar8;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage ==
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        if ((ushort)((uVar8 & 0xff) - 3) < 0xfffe) {
          main_cold_9();
        }
      }
      else {
        main_cold_8();
      }
      break;
    case 0x6d:
      options.allowMirroring = true;
    case 0x75:
      options.allowDedup = true;
      break;
    case 0x6e:
      uVar8 = parseNumber((char **)&local_158._M_first,"Number of palettes",0x100);
      options.nbPalettes = (uint8_t)uVar8;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        error("Number of palettes (-n) must be a valid number, not \"%s\"",musl_optarg);
      }
      if (options.nbPalettes == '\0') {
        pcVar15 = "Number of palettes (-n) may not be 0!";
        goto LAB_001050ed;
      }
      break;
    case 0x6f:
      this_00 = &options.output;
      if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar15 = "Overriding tile data file %s";
        goto LAB_00104ef9;
      }
      goto LAB_00104f03;
    case 0x70:
      _ZL12localOptions_3 = 0;
      this_00 = &options.palettes;
      if (options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar15 = "Overriding palettes file %s";
        goto LAB_00104ef9;
      }
      goto LAB_00104f03;
    case 0x71:
      _ZL12localOptions_4 = 0;
      this_00 = &options.palmap;
      if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar15 = "Overriding palette map file %s";
        goto LAB_00104ef9;
      }
      goto LAB_00104f03;
    case 0x72:
      options.reversedWidth =
           parseNumber((char **)&local_158._M_first,"Reversed image stride",0xffff);
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        error("Reversed image stride (-r) must be a valid number, not \"%s\"",musl_optarg);
      }
      if (options.reversedWidth == 0) {
        pcVar15 = "Reversed image stride (-r) may not be 0!";
        goto LAB_001050ed;
      }
      break;
    case 0x73:
      uVar8 = parseNumber((char **)&local_158._M_first,"Number of colors per palette",4);
      options.nbColorsPerPal = (uint8_t)uVar8;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        error("Palette size (-s) must be a valid number, not \"%s\"",musl_optarg);
      }
      if (options.nbColorsPerPal < 5) {
        if (options.nbColorsPerPal != '\0') break;
        pcVar15 = "Palette size (-s) may not be 0!";
      }
      else {
        pcVar15 = "Palette size (-s) must not exceed 4!";
      }
LAB_001050ed:
      error(pcVar15);
      break;
    case 0x74:
      _ZL12localOptions_2 = 0;
      this_00 = &options.tilemap;
      if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar15 = "Overriding tilemap file %s";
        goto LAB_00104ef9;
      }
LAB_00104f03:
      std::optional<std::filesystem::__cxx11::path>::operator=(this_00,&musl_optarg);
      break;
    case 0x76:
      if (options.verbosity < 6) {
        options.verbosity = options.verbosity + '\x01';
      }
      break;
    case 0x78:
      uVar8 = parseNumber((char **)&local_158._M_first,"Number of tiles to trim",0);
      options.trim = (uint64_t)uVar8;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_158._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        main_cold_1();
      }
    }
LAB_00104f12:
    __p = (AtFileStackEntry *)argv;
    iVar9 = musl_getopt_long_only
                      (iVar19,argv,"-Aa:b:Cc:Dd:FfhL:mN:n:Oo:Pp:Qq:r:s:Tt:U:uVvx:Z",longopts,
                       (int *)0x0);
  }
  if (iVar9 < -0x41) {
    if (iVar9 == -0x54) {
      warning("`--output-tilemap` is deprecated, use `--auto-tilemap` instead");
      goto switchD_001049f0_caseD_54;
    }
    if (iVar9 == -0x51) {
      warning("`--output-palette-map` is deprecated, use `--auto-palette-map` instead");
      goto switchD_001049f0_caseD_51;
    }
    if (iVar9 == -0x50) {
      warning("`--output-palette` is deprecated, use `--auto-palette` instead");
      goto switchD_001049f0_caseD_50;
    }
  }
  else {
    if (iVar9 == 1) {
      if (*musl_optarg != '@') {
        registerInput((char *)0x104a22);
        goto LAB_00104f12;
      }
      local_60[0]._M_p = musl_optarg + 1;
      __l._M_len = 1;
      __l._M_array = &local_60[0]._M_p;
      __args_1 = &local_1d8;
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)&local_158._M_first,__l,
                 (allocator_type *)&local_1d8);
      pAVar6 = local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pAVar5 = local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) goto LAB_00105916;
        lVar22 = (long)local_198.
                       super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar23 = lVar22 * 0x6db6db6db6db6db7;
        uVar12 = uVar23;
        if (local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar12 = 1;
        }
        uVar24 = uVar12 + uVar23;
        pvVar17 = (vector<char_*,_std::allocator<char_*>_> *)0x249249249249249;
        if (0x249249249249248 < uVar24) {
          uVar24 = 0x249249249249249;
        }
        if (CARRY8(uVar12,uVar23)) {
          uVar24 = 0x249249249249249;
        }
        if (uVar24 == 0) {
          pAVar13 = (pointer)0x0;
          piVar16 = __args;
        }
        else {
          pAVar13 = (pointer)operator_new(uVar24 * 0x38);
          piVar16 = extraout_RDX;
        }
        __p_00 = &local_158;
        local_178 = uVar24;
        std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
        construct<main::AtFileStackEntry,int&,std::vector<char*,std::allocator<char*>>>
                  ((allocator_type *)(&pAVar13->parentInd + lVar22 * 2),
                   (AtFileStackEntry *)&__p_00->_M_first,piVar16,pvVar17);
        local_170 = pAVar13;
        for (__a = pAVar5; pAVar6 != __a; __a = __a + 1) {
          pAVar13->parentInd = __a->parentInd;
          ppcVar2 = (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          (pAVar13->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          (pAVar13->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppcVar2;
          (pAVar13->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          pcVar3 = (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          (pAVar13->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
          (pAVar13->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar3;
          (pAVar13->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
          destroy<main::AtFileStackEntry>
                    ((allocator_type *)__a,(AtFileStackEntry *)&__p_00->_M_first);
          pAVar13 = pAVar13 + 1;
        }
        if (pAVar5 != (pointer)0x0) {
          operator_delete(pAVar5,(long)local_198.
                                       super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pAVar5);
        }
        local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_start = local_170;
        local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_170 + local_178;
      }
      else {
        std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
        construct<main::AtFileStackEntry,int&,std::vector<char*,std::allocator<char*>>>
                  ((allocator_type *)
                   local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (AtFileStackEntry *)&local_158._M_first,__args,
                   (vector<char_*,_std::allocator<char_*>_> *)__args_1);
        pAVar13 = pAVar6;
      }
      local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = pAVar13 + 1;
      if (local_158._M_first._M_storage != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
        operator_delete((void *)local_158._M_first._M_storage,local_158._16_8_ - local_158._0_8_);
      }
      local_160 = musl_optarg + 1;
      std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                ((path *)local_60,&local_160,auto_format);
      local_158._M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
      local_68 = 0;
      iVar9 = File::open((File *)&local_158._M_first,(char *)local_60,8);
      if (CONCAT44(extraout_var,iVar9) == 0) {
        local_38.super_anon_class_8_1_89901123.path =
             (anon_class_8_1_89901123)(anon_class_8_1_89901123)local_60;
        std::
        visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                  (&local_1d8,&local_38,
                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    *)&local_158._M_first);
        _Var4._M_p = local_1d8._M_dataplus._M_p;
        piVar16 = __errno_location();
        pcVar15 = strerror(*piVar16);
        fatal("Error reading @%s: %s",_Var4._M_p,pcVar15);
      }
      this = &pAVar13->argPool;
      local_1b8 = (pointer)0x0;
      puVar25 = (pointer)0x0;
      do {
        pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                  *)&local_1d8,
                                 (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                  *)&local_158._M_first);
        pbVar1 = *(byte **)(pbVar14 + 0x10);
        if (pbVar1 < *(byte **)(pbVar14 + 0x18)) {
          uVar10 = (uint)*pbVar1;
          *(byte **)(pbVar14 + 0x10) = pbVar1 + 1;
        }
        else {
          uVar10 = (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
          if (uVar10 == 0xffffffff) goto LAB_00105665;
        }
        iVar9 = isblank(uVar10);
        if ((iVar9 == 0) && (uVar10 != 10)) {
          if (uVar10 == 0xd) {
            pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                      *)&local_1d8,
                                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                      *)&local_158._M_first);
            if (*(ulong *)(pbVar14 + 0x10) < *(ulong *)(pbVar14 + 0x18)) {
              *(ulong *)(pbVar14 + 0x10) = *(ulong *)(pbVar14 + 0x10) + 1;
            }
            else {
              (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
            }
          }
          else if (uVar10 == 0x23) {
            do {
              pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                        *)&local_1d8,
                                       (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                        *)&local_158._M_first);
              pbVar1 = *(byte **)(pbVar14 + 0x10);
              if (pbVar1 < *(byte **)(pbVar14 + 0x18)) {
                uVar10 = (uint)*pbVar1;
                *(byte **)(pbVar14 + 0x10) = pbVar1 + 1;
              }
              else {
                uVar10 = (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
              }
              if (uVar10 == 0xffffffff) goto LAB_00105665;
            } while (uVar10 != 10);
          }
          else {
            do {
              local_1d8._M_dataplus._M_p =
                   (pAVar13->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   -(long)(pAVar13->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl
                          .super__Vector_impl_data._M_start;
              if (puVar25 == (pointer)0x0) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8,
                           (iterator)0x0,(unsigned_long *)&local_1d8);
              }
              else {
                *puVar25 = (unsigned_long)local_1d8._M_dataplus._M_p;
                puVar25 = puVar25 + 1;
              }
              local_1d8._M_dataplus._M_p._0_1_ = (char)uVar10;
              std::vector<char,_std::allocator<char>_>::emplace_back<char>(this,(char *)&local_1d8);
              while( true ) {
                pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                          *)&local_1d8,
                                         (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                          *)&local_158._M_first);
                pbVar1 = *(byte **)(pbVar14 + 0x10);
                if (pbVar1 < *(byte **)(pbVar14 + 0x18)) {
                  uVar10 = (uint)*pbVar1;
                  *(byte **)(pbVar14 + 0x10) = pbVar1 + 1;
                }
                else {
                  uVar10 = (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
                }
                if (((uVar10 == 0xffffffff) || (uVar10 == 10)) ||
                   (iVar9 = isblank(uVar10), iVar9 != 0)) goto LAB_0010556d;
                if (uVar10 == 0xd) break;
                local_1d8._M_dataplus._M_p._0_1_ = (char)uVar10;
                std::vector<char,_std::allocator<char>_>::emplace_back<char>
                          (this,(char *)&local_1d8);
              }
              pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                        *)&local_1d8,
                                       (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                        *)&local_158._M_first);
              if (*(ulong *)(pbVar14 + 0x10) < *(ulong *)(pbVar14 + 0x18)) {
                *(ulong *)(pbVar14 + 0x10) = *(ulong *)(pbVar14 + 0x10) + 1;
              }
              else {
                (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
              }
LAB_0010556d:
              local_1d8._M_dataplus._M_p = local_1d8._M_dataplus._M_p & 0xffffffffffffff00;
              std::vector<char,_std::allocator<char>_>::emplace_back<char>(this,(char *)&local_1d8);
              while (iVar9 = isblank(uVar10), iVar9 != 0) {
                pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                          *)&local_1d8,
                                         (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                          *)&local_158._M_first);
                pbVar1 = *(byte **)(pbVar14 + 0x10);
                if (pbVar1 < *(byte **)(pbVar14 + 0x18)) {
                  uVar10 = (uint)*pbVar1;
                  *(byte **)(pbVar14 + 0x10) = pbVar1 + 1;
                }
                else {
                  uVar10 = (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
                }
              }
              if (uVar10 == 0xd) {
                pbVar14 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                          *)&local_1d8,
                                         (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                          *)&local_158._M_first);
                pbVar1 = *(byte **)(pbVar14 + 0x10);
                if (pbVar1 < *(byte **)(pbVar14 + 0x18)) {
                  uVar10 = (uint)*pbVar1;
                  *(byte **)(pbVar14 + 0x10) = pbVar1 + 1;
                }
                else {
                  uVar10 = (**(code **)(*(long *)pbVar14 + 0x50))(pbVar14);
                }
              }
            } while ((uVar10 != 0xffffffff) && (uVar10 != 10));
          }
        }
      } while( true );
    }
    if (iVar9 == -0x41) {
      warning("`--output-attr-map` is deprecated, use `--auto-attr-map` instead");
      goto switchD_001049f0_caseD_41;
    }
  }
switchD_001049f0_caseD_42:
  main_cold_12();
switchD_001049f0_caseD_56:
  pcVar15 = get_package_version_string();
  printf("rgbgfx %s\n",pcVar15);
  exit(0);
LAB_00105168:
  if (iVar19 != musl_optind) {
    if (iVar19 <= musl_optind) {
      __assert_fail("musl_optind < curArgc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/main.cpp"
                    ,0x276,"main");
    }
    iVar19 = iVar19 - musl_optind;
    iVar9 = 0;
    do {
      registerInput((char *)0x105195);
      iVar9 = iVar9 + 1;
    } while (iVar19 != iVar9);
  }
  pAVar6 = local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pAVar5 = local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar10 = (uint)options.nbColorsPerPal;
    pcVar15 = (char *)(ulong)(uint)options.bitDepth;
    uVar18 = 1 << (options.bitDepth & 0x1f);
    if (uVar10 == 0) {
      options.nbColorsPerPal = (uint8_t)uVar18;
    }
    else if (uVar18 < uVar10) {
      pcVar15 = (char *)(ulong)uVar10;
      error("%ubpp palettes can only contain %u colors, not %u",(ulong)(uint)options.bitDepth);
    }
    main::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_1,true,
               (optional<std::filesystem::__cxx11::path> *)".attrmap",pcVar15);
    main::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_2,true,
               (optional<std::filesystem::__cxx11::path> *)".tilemap",pcVar15);
    main::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_3,true,
               (optional<std::filesystem::__cxx11::path> *)".pal",pcVar15);
    main::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_4,true,
               (optional<std::filesystem::__cxx11::path> *)".palmap",pcVar15);
    if (_ZL12localOptions_0 != (char *)0x0) {
      parseExternalPalSpec(_ZL12localOptions_0);
    }
    if (options.verbosity != '\0') {
      get_package_version_string();
      main_cold_13();
    }
    if (nbErrors == 0) {
      if (options.input.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
        if (options.reversedWidth == 0) {
          process();
        }
        else {
          reverse();
        }
      }
      else {
        if (((options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
              _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>
              .super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != true) ||
            (options.palSpecType != EXPLICIT)) || (options.reversedWidth != 0)) {
          main_cold_14();
LAB_00105916:
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        processPalettes();
      }
      if (nbErrors == 0) {
        std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::~vector(&local_198);
        return 0;
      }
    }
    giveUp();
  }
  pAVar13 = local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish + -1;
  musl_optind = local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].parentInd;
  local_198.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = pAVar13;
  std::allocator_traits<std::allocator<main::AtFileStackEntry>>::destroy<main::AtFileStackEntry>
            ((allocator_type *)pAVar13,__p);
  uVar12 = (ulong)local_17c;
  argv = (char **)local_168;
  if (pAVar5 != pAVar13) {
    argv = pAVar6[-2].argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    uVar12 = (ulong)((long)pAVar6[-2].argv.super__Vector_base<char_*,_std::allocator<char_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)argv) >> 3;
  }
  goto LAB_001049a3;
LAB_00105665:
  File::~File((File *)&local_158._M_first);
  std::filesystem::__cxx11::path::~path((path *)local_60);
  pvVar17 = &pAVar13->argv;
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            (pvVar17,((long)puVar25 - (long)local_1b8 >> 3) + 2);
  in_stack_fffffffffffffe50 = puVar25;
  for (puVar20 = local_1b8; puVar20 != puVar25; puVar20 = puVar20 + 1) {
    local_158._M_first._M_storage =
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
         ((this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start + *puVar20);
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)pvVar17,(char **)&local_158._M_first);
  }
  local_158._M_first._M_storage =
       (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
       (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)pvVar17,(char **)&local_158._M_first);
  argv = (pAVar13->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  ppcVar2 = (pAVar13->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  musl_optind = 1;
  if (local_1b8 != (pointer)0x0) {
    operator_delete(local_1b8,-(long)local_1b8);
  }
  uVar12 = (ulong)((int)((ulong)((long)ppcVar2 - (long)argv) >> 3) - 1);
  goto LAB_001049a3;
}

Assistant:

int main(int argc, char *argv[]) {
	struct AtFileStackEntry {
		int parentInd; // Saved offset into parent argv
		std::vector<char *> argv; // This context's arg pointer vec
		std::vector<char> argPool;

		AtFileStackEntry(int parentInd_, std::vector<char *> argv_)
		    : parentInd(parentInd_), argv(argv_) {}
	};
	std::vector<AtFileStackEntry> atFileStack;

	int curArgc = argc;
	char **curArgv = argv;
	for (;;) {
		char *atFileName = parseArgv(curArgc, curArgv);
		if (atFileName) {
			// Copy `argv[0]` for error reporting, and because option parsing skips it
			AtFileStackEntry &stackEntry =
			    atFileStack.emplace_back(musl_optind, std::vector{atFileName});
			// It would be nice to compute the char pointers on the fly, but reallocs don't allow
			// that; so we must compute the offsets after the pool is fixed
			auto offsets = readAtFile(&musl_optarg[1], stackEntry.argPool);
			stackEntry.argv.reserve(offsets.size() + 2); // Avoid a bunch of reallocs
			for (size_t ofs : offsets) {
				stackEntry.argv.push_back(&stackEntry.argPool.data()[ofs]);
			}
			stackEntry.argv.push_back(nullptr); // Don't forget the arg vector terminator!

			curArgc = stackEntry.argv.size() - 1;
			curArgv = stackEntry.argv.data();
			musl_optind = 1; // Don't use 0 because we're not scanning a different argv per se
			continue; // Begin scanning that arg vector
		}

		if (musl_optind != curArgc) {
			// This happens if `--` is passed, process the remaining arg(s) as positional
			assert(musl_optind < curArgc);
			for (int i = musl_optind; i < curArgc; ++i) {
				registerInput(argv[i]);
			}
		}

		// Pop off the top stack entry, or end parsing if none
		if (atFileStack.empty()) {
			break;
		}
		// OK to restore `optind` directly, because `optpos` must be 0 right now.
		// (Providing 0 would be a "proper" reset, but we want to resume parsing)
		musl_optind = atFileStack.back().parentInd;
		atFileStack.pop_back();
		if (atFileStack.empty()) {
			curArgc = argc;
			curArgv = argv;
		} else {
			auto &vec = atFileStack.back().argv;
			curArgc = vec.size();
			curArgv = vec.data();
		}
	}

	if (options.nbColorsPerPal == 0) {
		options.nbColorsPerPal = 1u << options.bitDepth;
	} else if (options.nbColorsPerPal > 1u << options.bitDepth) {
		error("%" PRIu8 "bpp palettes can only contain %u colors, not %" PRIu8, options.bitDepth,
		      1u << options.bitDepth, options.nbColorsPerPal);
	}

	auto autoOutPath = [](bool autoOptEnabled, std::optional<std::filesystem::path> &path,
	                      char const *extension) {
		if (autoOptEnabled) {
			auto image = localOptions.groupOutputs ? options.output : options.input;
			if (!image.has_value()) {
				fprintf(stderr, "FATAL: No %s specified\n", localOptions.groupOutputs
				      ? "output tile data file" : "input image");
				printUsage();
				exit(1);
			}
			path.emplace(*image).replace_extension(extension);
		}
	};
	autoOutPath(localOptions.autoAttrmap, options.attrmap, ".attrmap");
	autoOutPath(localOptions.autoTilemap, options.tilemap, ".tilemap");
	autoOutPath(localOptions.autoPalettes, options.palettes, ".pal");
	autoOutPath(localOptions.autoPalmap, options.palmap, ".palmap");

	// Execute deferred external pal spec parsing, now that all other params are known
	if (localOptions.externalPalSpec) {
		parseExternalPalSpec(localOptions.externalPalSpec);
	}

	if (options.verbosity >= Options::VERB_CFG) {
		fprintf(stderr, "rgbgfx %s\n", get_package_version_string());

		if (options.verbosity >= Options::VERB_VVVVVV) {
			putc('\n', stderr);
			static std::array<uint16_t, 21> gfx{
			    0x1FE, 0x3FF, 0x399, 0x399, 0x3FF, 0x3FF, 0x381, 0x3C3, 0x1FE, 0x078, 0x1FE,
			    0x3FF, 0x3FF, 0x3FF, 0x37B, 0x37B, 0x0FC, 0x0CC, 0x1CE, 0x1CE, 0x1CE,
			};
			static std::array<char const *, 3> textbox{
			    "  ,----------------------------------------.",
			    "  | Augh, dimensional interference again?! |",
			    "  `----------------------------------------'"};
			for (size_t i = 0; i < gfx.size(); ++i) {
				uint16_t row = gfx[i];
				for (uint8_t _ = 0; _ < 10; ++_) {
					unsigned char c = row & 1 ? '0' : ' ';
					putc(c, stderr);
					// Double the pixel horizontally, otherwise the aspect ratio looks wrong
					putc(c, stderr);
					row >>= 1;
				}
				if (i < textbox.size()) {
					fputs(textbox[i], stderr);
				}
				putc('\n', stderr);
			}
			putc('\n', stderr);
		}

		fputs("Options:\n", stderr);
		if (options.columnMajor)
			fputs("\tVisit image in column-major order\n", stderr);
		if (options.allowMirroring)
			fputs("\tAllow mirroring tiles\n", stderr);
		if (options.allowDedup)
			fputs("\tAllow deduplicating tiles\n", stderr);
		if (options.useColorCurve)
			fputs("\tUse color curve\n", stderr);
		fprintf(stderr, "\tBit depth: %" PRIu8 "bpp\n", options.bitDepth);
		if (options.trim != 0)
			fprintf(stderr, "\tTrim the last %" PRIu64 " tiles\n", options.trim);
		fprintf(stderr, "\tMaximum %" PRIu8 " palettes\n", options.nbPalettes);
		fprintf(stderr, "\tPalettes contain %" PRIu8 " colors\n", options.nbColorsPerPal);
		fprintf(stderr, "\t%s palette spec\n", []() {
			switch (options.palSpecType) {
			case Options::NO_SPEC:
				return "No";
			case Options::EXPLICIT:
				return "Explicit";
			case Options::EMBEDDED:
				return "Embedded";
			}
			return "???";
		}());
		if (options.palSpecType == Options::EXPLICIT) {
			fputs("\t[\n", stderr);
			for (std::array<Rgba, 4> const &pal : options.palSpec) {
				fprintf(stderr, "\t\t#%06x, #%06x, #%06x, #%06x,\n", pal[0].toCSS() >> 8,
				        pal[1].toCSS() >> 8, pal[2].toCSS() >> 8, pal[3].toCSS() >> 8);
			}
			fputs("\t]\n", stderr);
		}
		fprintf(stderr,
		        "\tInput image slice: %" PRIu32 "x%" PRIu32 " pixels starting at (%" PRIi32
		        ", %" PRIi32 ")\n",
		        options.inputSlice.width, options.inputSlice.height, options.inputSlice.left,
		        options.inputSlice.top);
		fprintf(stderr, "\tBase tile IDs: [%" PRIu8 ", %" PRIu8 "]\n", options.baseTileIDs[0],
		        options.baseTileIDs[1]);
		fprintf(stderr, "\tMaximum %" PRIu16 " tiles in bank 0, %" PRIu16 " in bank 1\n",
		        options.maxNbTiles[0], options.maxNbTiles[1]);
		auto printPath = [](char const *name,
		                    std::optional<std::filesystem::path> const &path) {
			if (path.has_value()) {
				fprintf(stderr, "\t%s: %s\n", name, path->c_str());
			}
		};
		printPath("Input image", options.input);
		printPath("Output tile data", options.output);
		printPath("Output tilemap", options.tilemap);
		printPath("Output attrmap", options.attrmap);
		printPath("Output palettes", options.palettes);
		fputs("Ready.\n", stderr);
	}

	// Do not do anything if option parsing went wrong
	if (nbErrors) {
		giveUp();
	}

	if (options.input.has_value()) {
		if (options.reverse()) {
			reverse();
		} else {
			process();
		}
	} else if (options.palettes.has_value() && options.palSpecType == Options::EXPLICIT
		&& !options.reverse()) {
		processPalettes();
	} else {
		fputs("FATAL: No input image specified\n", stderr);
		printUsage();
		exit(1);
	}

	if (nbErrors) {
		giveUp();
	}
	return 0;
}